

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O1

char * stringcache(StringCache *cache,char *str)

{
  char *__s1;
  StringBucket **ppSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  StringBucket *pSVar6;
  ulong uVar7;
  StringBucket *pSVar8;
  StringBucket *pSVar9;
  ulong __n;
  char *local_40;
  
  sVar5 = strlen(str);
  __n = sVar5 & 0xffffffff;
  if (__n == 0) {
    uVar3 = 5;
  }
  else {
    uVar3 = 0x1505;
    uVar7 = 0;
    do {
      uVar3 = (uint)(byte)str[uVar7] ^ uVar3 * 0x21;
      uVar7 = uVar7 + 1;
    } while (__n != uVar7);
    uVar3 = uVar3 & 0xff;
  }
  uVar3 = cache->table_size - 1 & uVar3;
  pSVar6 = (StringBucket *)0x0;
  pSVar9 = cache->hashtable[uVar3];
  do {
    if (pSVar9 == (StringBucket *)0x0) {
      pSVar6 = (StringBucket *)malloc(__n + 0x11);
      if (pSVar6 != (StringBucket *)0x0) {
        pSVar6->string = (char *)(pSVar6 + 1);
        memcpy(pSVar6 + 1,str,__n);
        *(undefined1 *)((long)&pSVar6[1].string + __n) = 0;
        ppSVar1 = cache->hashtable;
        pSVar6->next = ppSVar1[uVar3];
        ppSVar1[uVar3] = pSVar6;
        return pSVar6->string;
      }
      return (char *)0x0;
    }
    __s1 = pSVar9->string;
    iVar4 = strncmp(__s1,str,__n);
    if ((iVar4 == 0) && (__s1[__n] == '\0')) {
      if (pSVar6 != (StringBucket *)0x0) {
        if (pSVar6->next != pSVar9) {
          __assert_fail("prev->next == bucket",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/icculus[P]altrace/altrace_common.c"
                        ,0xec,
                        "const char *stringcache_len_internal(StringCache *, const char *, const unsigned int, const int)"
                       );
        }
        pSVar6->next = pSVar9->next;
        ppSVar1 = cache->hashtable;
        pSVar9->next = ppSVar1[uVar3];
        ppSVar1[uVar3] = pSVar9;
      }
      bVar2 = false;
      pSVar8 = pSVar9;
      local_40 = __s1;
    }
    else {
      bVar2 = true;
      pSVar8 = pSVar9->next;
      pSVar6 = pSVar9;
    }
    pSVar9 = pSVar8;
  } while (bVar2);
  return local_40;
}

Assistant:

const char *stringcache(StringCache *cache, const char *str)
{
    return stringcache_len(cache, str, strlen(str));
}